

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  cmGeneratorTarget *this_00;
  cmMakefile *pcVar2;
  char *pcVar3;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  string cudaLinkCmd_1;
  string local_90;
  undefined1 local_70 [8];
  string cudaLinkCmd;
  string local_40 [8];
  string linkCmd;
  cmNinjaNormalTargetGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *linkCmds;
  
  linkCmd.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  this_00 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar1 = cmGeneratorTarget::GetType(this_00);
  if (TVar1 == EXECUTABLE) {
    pcVar2 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",&local_d9);
    pcVar3 = cmMakefile::GetDefinition(pcVar2,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b8,pcVar3,&local_da);
    std::allocator<char>::~allocator((allocator<char> *)&local_da);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    cmSystemTools::ExpandListArgument((string *)local_b8,__return_storage_ptr__,false);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else if (TVar1 - STATIC_LIBRARY < 3) {
    pcVar2 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
               (allocator *)(cudaLinkCmd_1.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetDefinition(pcVar2,&local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_70,pcVar3,(allocator *)(cudaLinkCmd_1.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(cudaLinkCmd_1.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(cudaLinkCmd_1.field_2._M_local_buf + 0xf));
    cmSystemTools::ExpandListArgument((string *)local_70,__return_storage_ptr__,false);
    std::__cxx11::string::~string((string *)local_70);
  }
  linkCmd.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_40);
  if ((linkCmd.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeDeviceLinkCmd()
{
  std::vector<std::string> linkCmds;

  // this target requires separable cuda compilation
  // now build the correct command depending on if the target is
  // an executable or a dynamic library.
  std::string linkCmd;
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      const std::string cudaLinkCmd(
        this->GetMakefile()->GetDefinition("CMAKE_CUDA_DEVICE_LINK_LIBRARY"));
      cmSystemTools::ExpandListArgument(cudaLinkCmd, linkCmds);
    } break;
    case cmStateEnums::EXECUTABLE: {
      const std::string cudaLinkCmd(this->GetMakefile()->GetDefinition(
        "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE"));
      cmSystemTools::ExpandListArgument(cudaLinkCmd, linkCmds);
    } break;
    default:
      break;
  }
  return linkCmds;
}